

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_reader_remaining(mpack_reader_t *reader,char **data)

{
  mpack_error_t mVar1;
  char **data_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    if (data != (char **)0x0) {
      *data = reader->data;
    }
    reader_local = (mpack_reader_t *)(reader->end + -(long)reader->data);
  }
  else {
    reader_local = (mpack_reader_t *)0x0;
  }
  return (size_t)reader_local;
}

Assistant:

size_t mpack_reader_remaining(mpack_reader_t* reader, const char** data) {
    if (mpack_reader_error(reader) != mpack_ok)
        return 0;

    #if MPACK_READ_TRACKING
    if (mpack_reader_flag_if_error(reader, mpack_track_check_empty(&reader->track)) != mpack_ok)
        return 0;
    #endif

    if (data)
        *data = reader->data;
    return (size_t)(reader->end - reader->data);
}